

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O3

char * lys_nodetype2str(uint16_t nodetype)

{
  undefined2 in_register_0000003a;
  
  if (CONCAT22(in_register_0000003a,nodetype) < 0x60) {
    switch(CONCAT22(in_register_0000003a,nodetype)) {
    case 1:
      return "container";
    case 2:
      return "choice";
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      return "leaf";
    case 8:
      return "leaf-list";
    default:
      if (CONCAT22(in_register_0000003a,nodetype) == 0x10) {
        return "list";
      }
      if (CONCAT22(in_register_0000003a,nodetype) == 0x20) {
        return "anyxml";
      }
    }
  }
  else if (CONCAT22(in_register_0000003a,nodetype) < 0x200) {
    if (CONCAT22(in_register_0000003a,nodetype) == 0x60) {
      return "anydata";
    }
    if (CONCAT22(in_register_0000003a,nodetype) == 0x80) {
      return "case";
    }
    if (CONCAT22(in_register_0000003a,nodetype) == 0x100) {
      return "RPC";
    }
  }
  else {
    if (CONCAT22(in_register_0000003a,nodetype) == 0x200) {
      return "action";
    }
    if (CONCAT22(in_register_0000003a,nodetype) == 0x400) {
      return "notification";
    }
    if (CONCAT22(in_register_0000003a,nodetype) == 0x800) {
      return "uses";
    }
  }
  return "unknown";
}

Assistant:

LIBYANG_API_DEF const char *
lys_nodetype2str(uint16_t nodetype)
{
    switch (nodetype) {
    case LYS_CONTAINER:
        return "container";
    case LYS_CHOICE:
        return "choice";
    case LYS_LEAF:
        return "leaf";
    case LYS_LEAFLIST:
        return "leaf-list";
    case LYS_LIST:
        return "list";
    case LYS_ANYXML:
        return "anyxml";
    case LYS_ANYDATA:
        return "anydata";
    case LYS_CASE:
        return "case";
    case LYS_RPC:
        return "RPC";
    case LYS_ACTION:
        return "action";
    case LYS_NOTIF:
        return "notification";
    case LYS_USES:
        return "uses";
    default:
        return "unknown";
    }
}